

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_calc_pframe_target_size_one_pass_cbr(AV1_COMP *cpi,FRAME_UPDATE_TYPE frame_update_type)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char in_SIL;
  long *in_RDI;
  AV1EncoderConfig *oxcf;
  int local_94;
  long local_90;
  int local_88;
  int local_80;
  int local_78;
  int local_74;
  int64_t max_rate;
  int pct_high;
  int pct_low;
  LAYER_CONTEXT *lc;
  int layer;
  int af_ratio_pct;
  int64_t target;
  int min_frame_target;
  int64_t one_pct_bits;
  int64_t diff;
  RateControlCfg *rc_cfg;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  
  lVar4 = *in_RDI;
  lVar2 = *(long *)(lVar4 + 0xac78) - *(long *)(lVar4 + 0xad38);
  lVar3 = *(long *)(lVar4 + 0xac78) / 100 + 1;
  if (*(int *)((long)in_RDI + 0x607f4) >> 4 < 0xc9) {
    local_74 = 200;
  }
  else {
    local_74 = *(int *)((long)in_RDI + 0x607f4) >> 4;
  }
  lc._4_4_ = local_74;
  if (*(int *)((long)in_RDI + 0x423bc) == 0) {
    _pct_high = (long)*(int *)((long)in_RDI + 0x607f4);
  }
  else {
    iVar1 = *(int *)((long)in_RDI + 0x423bc) + 100;
    if ((in_SIL == '\x02') || (in_SIL == '\x04')) {
      _pct_high = ((long)*(int *)((long)in_RDI + 0x607f4) * (long)*(int *)(lVar4 + 0xac60) *
                  (long)iVar1) / (long)(*(int *)(lVar4 + 0xac60) * 100 + iVar1 + -100);
    }
    else {
      _pct_high = ((long)*(int *)((long)in_RDI + 0x607f4) * (long)*(int *)(lVar4 + 0xac60) * 100) /
                  (long)(*(int *)(lVar4 + 0xac60) * 100 + iVar1 + -100);
    }
  }
  if (*(int *)(*in_RDI + 0xc750) != 0) {
    lVar4 = in_RDI[0x13a91] +
            (long)((int)in_RDI[0x13a66] * *(int *)((long)in_RDI + 0x9d33c) +
                  *(int *)((long)in_RDI + 0x9d334)) * 0x3380;
    _pct_high = (long)*(int *)(lVar4 + 0x3348);
    if (*(int *)(lVar4 + 0x3348) >> 4 < 0xc9) {
      local_78 = 200;
    }
    else {
      local_78 = *(int *)(lVar4 + 0x3348) >> 4;
    }
    lc._4_4_ = local_78;
  }
  if (lVar2 < 1) {
    if (lVar2 < 0) {
      if (-lVar2 / lVar3 < (long)*(int *)((long)in_RDI + 0x423cc)) {
        local_88 = (int)(-lVar2 / lVar3);
      }
      else {
        local_88 = *(int *)((long)in_RDI + 0x423cc);
      }
      _pct_high = (_pct_high * local_88) / 200 + _pct_high;
    }
  }
  else {
    if (lVar2 / lVar3 < (long)(int)in_RDI[0x8479]) {
      local_80 = (int)(lVar2 / lVar3);
    }
    else {
      local_80 = (int)in_RDI[0x8479];
    }
    _pct_high = _pct_high - (_pct_high * local_80) / 200;
  }
  if ((int)in_RDI[0x8477] != 0) {
    local_90 = (long)((long)*(int *)((long)in_RDI + 0x607f4) * (ulong)*(uint *)(in_RDI + 0x8477)) /
               100;
    if (_pct_high < local_90) {
      local_90 = _pct_high;
    }
    _pct_high = local_90;
  }
  if (0x7fffffff < _pct_high) {
    _pct_high = 0x7fffffff;
  }
  local_94 = (int)_pct_high;
  if (local_94 < lc._4_4_) {
    local_94 = lc._4_4_;
  }
  return local_94;
}

Assistant:

int av1_calc_pframe_target_size_one_pass_cbr(
    const AV1_COMP *cpi, FRAME_UPDATE_TYPE frame_update_type) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  const RateControlCfg *rc_cfg = &oxcf->rc_cfg;
  const int64_t diff = p_rc->optimal_buffer_level - p_rc->buffer_level;
  const int64_t one_pct_bits = 1 + p_rc->optimal_buffer_level / 100;
  int min_frame_target =
      AOMMAX(rc->avg_frame_bandwidth >> 4, FRAME_OVERHEAD_BITS);
  int64_t target;

  if (rc_cfg->gf_cbr_boost_pct) {
    const int af_ratio_pct = rc_cfg->gf_cbr_boost_pct + 100;
    if (frame_update_type == GF_UPDATE || frame_update_type == OVERLAY_UPDATE) {
      target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
                af_ratio_pct) /
               (p_rc->baseline_gf_interval * 100 + af_ratio_pct - 100);
    } else {
      target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
                100) /
               (p_rc->baseline_gf_interval * 100 + af_ratio_pct - 100);
    }
  } else {
    target = rc->avg_frame_bandwidth;
  }
  if (cpi->ppi->use_svc) {
    // Note that for layers, avg_frame_bandwidth is the cumulative
    // per-frame-bandwidth. For the target size of this frame, use the
    // layer average frame size (i.e., non-cumulative per-frame-bw).
    int layer =
        LAYER_IDS_TO_IDX(cpi->svc.spatial_layer_id, cpi->svc.temporal_layer_id,
                         cpi->svc.number_temporal_layers);
    const LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
    target = lc->avg_frame_size;
    min_frame_target = AOMMAX(lc->avg_frame_size >> 4, FRAME_OVERHEAD_BITS);
  }
  if (diff > 0) {
    // Lower the target bandwidth for this frame.
    const int pct_low =
        (int)AOMMIN(diff / one_pct_bits, rc_cfg->under_shoot_pct);
    target -= (target * pct_low) / 200;
  } else if (diff < 0) {
    // Increase the target bandwidth for this frame.
    const int pct_high =
        (int)AOMMIN(-diff / one_pct_bits, rc_cfg->over_shoot_pct);
    target += (target * pct_high) / 200;
  }
  if (rc_cfg->max_inter_bitrate_pct) {
    const int64_t max_rate =
        (int64_t)rc->avg_frame_bandwidth * rc_cfg->max_inter_bitrate_pct / 100;
    target = AOMMIN(target, max_rate);
  }
  if (target > INT_MAX) target = INT_MAX;
  return AOMMAX(min_frame_target, (int)target);
}